

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

int QTest::qToInt(char *str)

{
  long lVar1;
  long in_FS_OFFSET;
  char *pEnd;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pEnd = &DAT_aaaaaaaaaaaaaaaa;
  lVar1 = strtol(str,&pEnd,10);
  if (*pEnd != '\0') {
    fprintf(_stderr,"Invalid numeric parameter: \'%s\'\n",str);
    exit(1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)lVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int qToInt(const char *str)
{
    char *pEnd;
    int l = static_cast<int>(strtol(str, &pEnd, 10));
    if (*pEnd != 0) {
        std::fprintf(stderr, "Invalid numeric parameter: '%s'\n", str);
        exit(1);
    }
    return l;
}